

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *
Catch::Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
          (void)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>
  *in_stack_fffffffffffffff0;
  
  if (getInternal::s_instance ==
      (Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *)0x0) {
    pSVar1 = (Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *)
             operator_new(0x1b0);
    Singleton(in_stack_fffffffffffffff0);
    getInternal::s_instance = pSVar1;
    addSingleton((ISingleton *)0x3150b9);
  }
  return getInternal::s_instance;
}

Assistant:

static auto getInternal() -> Singleton* {
            static Singleton* s_instance = nullptr;
            if( !s_instance ) {
                s_instance = new Singleton;
                addSingleton( s_instance );
            }
            return s_instance;
        }